

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::~IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x88ca70;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x88cb88;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x88ca98;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x88cac0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x88cae8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x88cb10;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x88cb38;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x88cb60;
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x88cd38;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x88ce28;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x88cd60;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x88cd88;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       "\n1L";
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x88cdd8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x88ce00;
  if (*(undefined1 **)&this[-1].field_0x190 != &this[-1].field_0x1a0) {
    operator_delete(*(undefined1 **)&this[-1].field_0x190,*(long *)&this[-1].field_0x1a0 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)puVar1,&PTR_construction_vtable_24__0088cba8);
  operator_delete(puVar1,0x1c0);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}